

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer(ExistingFileNamer *this,ExistingFileNamer *x)

{
  long in_RSI;
  ApprovalNamer *in_RDI;
  
  ApprovalNamer::ApprovalNamer(in_RDI);
  in_RDI->_vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_002c55d8;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  in_RDI[5]._vptr_ApprovalNamer = *(_func_int ***)(in_RSI + 0x28);
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(const ExistingFileNamer& x)
        : filePath(x.filePath), options_(x.options_)
    {
    }